

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_to_storage(secp256k1_fe_storage *r,secp256k1_fe *a)

{
  secp256k1_fe *a_local;
  secp256k1_fe_storage *r_local;
  
  r->n[0] = a->n[0] | a->n[1] << 0x34;
  r->n[1] = a->n[1] >> 0xc | a->n[2] << 0x28;
  r->n[2] = a->n[2] >> 0x18 | a->n[3] << 0x1c;
  r->n[3] = a->n[3] >> 0x24 | a->n[4] << 0x10;
  return;
}

Assistant:

static void secp256k1_fe_to_storage(secp256k1_fe_storage *r, const secp256k1_fe *a) {
#ifdef VERIFY
    VERIFY_CHECK(a->normalized);
#endif
    r->n[0] = a->n[0] | a->n[1] << 52;
    r->n[1] = a->n[1] >> 12 | a->n[2] << 40;
    r->n[2] = a->n[2] >> 24 | a->n[3] << 28;
    r->n[3] = a->n[3] >> 36 | a->n[4] << 16;
}